

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_perform_append(connectdata *conn)

{
  void *pvVar1;
  char *pcVar2;
  char *mailbox;
  IMAP *imap;
  CURLcode result;
  connectdata *conn_local;
  
  pvVar1 = (conn->data->req).protop;
  if (*(long *)((long)pvVar1 + 8) == 0) {
    Curl_failf(conn->data,"Cannot APPEND without a mailbox.");
    conn_local._4_4_ = CURLE_URL_MALFORMAT;
  }
  else if ((conn->data->state).infilesize < 0) {
    Curl_failf(conn->data,"Cannot APPEND with unknown input file size\n");
    conn_local._4_4_ = CURLE_UPLOAD_FAILED;
  }
  else {
    pcVar2 = imap_atom(*(char **)((long)pvVar1 + 8));
    if (pcVar2 == (char *)0x0) {
      conn_local._4_4_ = CURLE_OUT_OF_MEMORY;
    }
    else {
      conn_local._4_4_ =
           imap_sendf(conn,"APPEND %s (\\Seen) {%ld}",pcVar2,(conn->data->state).infilesize);
      if (pcVar2 != (char *)0x0) {
        (*Curl_cfree)(pcVar2);
      }
      if (conn_local._4_4_ == CURLE_OK) {
        state(conn,IMAP_APPEND);
      }
    }
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode imap_perform_append(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct IMAP *imap = conn->data->req.protop;
  char *mailbox;

  /* Check we have a mailbox */
  if(!imap->mailbox) {
    failf(conn->data, "Cannot APPEND without a mailbox.");
    return CURLE_URL_MALFORMAT;
  }

  /* Check we know the size of the upload */
  if(conn->data->state.infilesize < 0) {
    failf(conn->data, "Cannot APPEND with unknown input file size\n");
    return CURLE_UPLOAD_FAILED;
  }

  /* Make sure the mailbox is in the correct atom format */
  mailbox = imap_atom(imap->mailbox);
  if(!mailbox)
    return CURLE_OUT_OF_MEMORY;

  /* Send the APPEND command */
  result = imap_sendf(conn, "APPEND %s (\\Seen) {%" CURL_FORMAT_CURL_OFF_T "}",
                      mailbox, conn->data->state.infilesize);

  Curl_safefree(mailbox);

  if(!result)
    state(conn, IMAP_APPEND);

  return result;
}